

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError FillInDevInfo(PaAlsaHostApiRepresentation *alsaApi,HwDevInfo *deviceHwInfo,int blocking,
                     PaAlsaDeviceInfo *devInfo,int *devIdx)

{
  int iVar1;
  PaError PVar2;
  PaUtilHostApiRepresentation *baseApi;
  snd_pcm_t *pcm;
  PaDeviceInfo *baseDeviceInfo;
  int *piStack_30;
  PaError result;
  int *devIdx_local;
  PaAlsaDeviceInfo *devInfo_local;
  HwDevInfo *pHStack_18;
  int blocking_local;
  HwDevInfo *deviceHwInfo_local;
  PaAlsaHostApiRepresentation *alsaApi_local;
  
  baseDeviceInfo._4_4_ = 0;
  baseApi = (PaUtilHostApiRepresentation *)0x0;
  pcm = (snd_pcm_t *)devInfo;
  piStack_30 = devIdx;
  devIdx_local = (int *)devInfo;
  devInfo_local._4_4_ = blocking;
  pHStack_18 = deviceHwInfo;
  deviceHwInfo_local = (HwDevInfo *)alsaApi;
  InitializeDeviceInfo(&devInfo->baseDeviceInfo);
  if ((((pHStack_18->hasCapture == 0) ||
       (iVar1 = OpenPcm((snd_pcm_t **)&baseApi,pHStack_18->alsaName,SND_PCM_STREAM_CAPTURE,
                        devInfo_local._4_4_,0), iVar1 < 0)) ||
      (PVar2 = GropeDevice((snd_pcm_t *)baseApi,pHStack_18->isPlug,StreamDirection_In,
                           devInfo_local._4_4_,(PaAlsaDeviceInfo *)devIdx_local), PVar2 == 0)) &&
     (((pHStack_18->hasPlayback == 0 ||
       (iVar1 = OpenPcm((snd_pcm_t **)&baseApi,pHStack_18->alsaName,SND_PCM_STREAM_PLAYBACK,
                        devInfo_local._4_4_,0), iVar1 < 0)) ||
      (PVar2 = GropeDevice((snd_pcm_t *)baseApi,pHStack_18->isPlug,StreamDirection_Out,
                           devInfo_local._4_4_,(PaAlsaDeviceInfo *)devIdx_local), PVar2 == 0)))) {
    *(undefined4 *)pcm = 2;
    *(int *)(pcm + 0x10) = deviceHwInfo_local[8].isPlug;
    *(char **)(pcm + 8) = pHStack_18->name;
    *(char **)(devIdx_local + 0x12) = pHStack_18->alsaName;
    devIdx_local[0x14] = pHStack_18->isPlug;
    if ((0 < *(int *)(pcm + 0x14)) || (0 < *(int *)(pcm + 0x18))) {
      if ((((alsaApi->baseHostApiRep).info.defaultInputDevice == -1) ||
          (iVar1 = strcmp(pHStack_18->alsaName,"default"), iVar1 == 0)) &&
         (0 < *(int *)(pcm + 0x14))) {
        (alsaApi->baseHostApiRep).info.defaultInputDevice = *piStack_30;
      }
      if ((((alsaApi->baseHostApiRep).info.defaultOutputDevice == -1) ||
          (iVar1 = strcmp(pHStack_18->alsaName,"default"), iVar1 == 0)) &&
         (0 < *(int *)(pcm + 0x18))) {
        (alsaApi->baseHostApiRep).info.defaultOutputDevice = *piStack_30;
      }
      (alsaApi->baseHostApiRep).deviceInfos[*piStack_30] = (PaDeviceInfo *)devIdx_local;
      *piStack_30 = *piStack_30 + 1;
    }
  }
  return baseDeviceInfo._4_4_;
}

Assistant:

static PaError FillInDevInfo( PaAlsaHostApiRepresentation *alsaApi, HwDevInfo* deviceHwInfo, int blocking,
        PaAlsaDeviceInfo* devInfo, int* devIdx )
{
    PaError result = 0;
    PaDeviceInfo *baseDeviceInfo = &devInfo->baseDeviceInfo;
    snd_pcm_t *pcm = NULL;
    PaUtilHostApiRepresentation *baseApi = &alsaApi->baseHostApiRep;

    PA_DEBUG(( "%s: Filling device info for: %s\n", __FUNCTION__, deviceHwInfo->name ));

    /* Zero fields */
    InitializeDeviceInfo( baseDeviceInfo );

    /* To determine device capabilities, we must open the device and query the
     * hardware parameter configuration space */

    /* Query capture */
    if( deviceHwInfo->hasCapture &&
        OpenPcm( &pcm, deviceHwInfo->alsaName, SND_PCM_STREAM_CAPTURE, blocking, 0 ) >= 0 )
    {
        if( GropeDevice( pcm, deviceHwInfo->isPlug, StreamDirection_In, blocking, devInfo ) != paNoError )
        {
            /* Error */
            PA_DEBUG(( "%s: Failed groping %s for capture\n", __FUNCTION__, deviceHwInfo->alsaName ));
            goto end;
        }
    }

    /* Query playback */
    if( deviceHwInfo->hasPlayback &&
        OpenPcm( &pcm, deviceHwInfo->alsaName, SND_PCM_STREAM_PLAYBACK, blocking, 0 ) >= 0 )
    {
        if( GropeDevice( pcm, deviceHwInfo->isPlug, StreamDirection_Out, blocking, devInfo ) != paNoError )
        {
            /* Error */
            PA_DEBUG(( "%s: Failed groping %s for playback\n", __FUNCTION__, deviceHwInfo->alsaName ));
            goto end;
        }
    }

    baseDeviceInfo->structVersion = 2;
    baseDeviceInfo->hostApi = alsaApi->hostApiIndex;
    baseDeviceInfo->name = deviceHwInfo->name;
    devInfo->alsaName = deviceHwInfo->alsaName;
    devInfo->isPlug = deviceHwInfo->isPlug;

    /* A: Storing pointer to PaAlsaDeviceInfo object as pointer to PaDeviceInfo object.
     * Should now be safe to add device info, unless the device supports neither capture nor playback
     */
    if( baseDeviceInfo->maxInputChannels > 0 || baseDeviceInfo->maxOutputChannels > 0 )
    {
        /* Make device default if there isn't already one or it is the ALSA "default" device */
        if( ( baseApi->info.defaultInputDevice == paNoDevice ||
            !strcmp( deviceHwInfo->alsaName, "default" ) ) && baseDeviceInfo->maxInputChannels > 0 )
        {
            baseApi->info.defaultInputDevice = *devIdx;
            PA_DEBUG(( "Default input device: %s\n", deviceHwInfo->name ));
        }
        if( ( baseApi->info.defaultOutputDevice == paNoDevice ||
            !strcmp( deviceHwInfo->alsaName, "default" ) ) && baseDeviceInfo->maxOutputChannels > 0 )
        {
            baseApi->info.defaultOutputDevice = *devIdx;
            PA_DEBUG(( "Default output device: %s\n", deviceHwInfo->name ));
        }
        PA_DEBUG(( "%s: Adding device %s: %d\n", __FUNCTION__, deviceHwInfo->name, *devIdx ));
        baseApi->deviceInfos[*devIdx] = (PaDeviceInfo *) devInfo;
        (*devIdx) += 1;
    }
    else
    {
        PA_DEBUG(( "%s: Skipped device: %s, all channels == 0\n", __FUNCTION__, deviceHwInfo->name ));
    }

end:
    return result;
}